

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O2

void __thiscall
libebml::MemIOCallback::setFilePointer(MemIOCallback *this,int64 Offset,seek_mode Mode)

{
  if (Mode == seek_end) {
    Offset = Offset + this->dataBufferTotalSize;
  }
  else {
    if (Mode == seek_current) {
      this->dataBufferPos = this->dataBufferPos + Offset;
      return;
    }
    if (Mode != seek_beginning) {
      return;
    }
  }
  this->dataBufferPos = Offset;
  return;
}

Assistant:

void MemIOCallback::setFilePointer(int64 Offset, seek_mode Mode)
{
  if (Mode == seek_beginning)
    dataBufferPos = Offset;
  else if (Mode == seek_current)
    dataBufferPos = dataBufferPos + Offset;
  else if (Mode == seek_end)
    dataBufferPos = dataBufferTotalSize + Offset;
}